

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O3

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindGreaterOrEqual
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key,Node **prev)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  Node *pNVar4;
  Node *pNVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (this->max_height_).super___atomic_base<int>._M_i;
  if (0 < iVar2) {
    uVar3 = iVar2 - 1;
    pNVar4 = this->head_;
    do {
      pNVar5 = pNVar4->next_[uVar3]._M_b._M_p;
      if ((pNVar5 == (Node *)0x0) ||
         (iVar2 = MemTable::KeyComparator::operator()(&this->compare_,pNVar5->key,*key), -1 < iVar2)
         ) {
        if (prev != (Node **)0x0) {
          prev[uVar3] = pNVar4;
        }
        if (uVar3 == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
            __stack_chk_fail();
          }
          return pNVar5;
        }
        uVar3 = uVar3 - 1;
        pNVar5 = pNVar4;
      }
      pNVar4 = pNVar5;
    } while (-1 < (int)uVar3);
  }
  __assert_fail("n >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/skiplist.h"
                ,0x9a,
                "Node *leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Node::Next(int) [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
               );
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindGreaterOrEqual(const Key& key,
                                              Node** prev) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    Node* next = x->Next(level);
    if (KeyIsAfterNode(key, next)) {
      // Keep searching in this list
      x = next;
    } else {
      if (prev != nullptr) prev[level] = x;
      if (level == 0) {
        return next;
      } else {
        // Switch to next list
        level--;
      }
    }
  }
}